

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O0

bool __thiscall cali::StringConverter::to_bool(StringConverter *this,bool *okptr)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  unsigned_long uVar2;
  unsigned_long i;
  undefined1 local_40 [8];
  string lower;
  bool res;
  bool ok;
  bool *okptr_local;
  StringConverter *this_local;
  
  lower.field_2._M_local_buf[0xf] = '\0';
  lower.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)local_40);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result = std::back_inserter<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,int(*)(int)noexcept>
            (__first,__last,__result,tolower);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"true");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"t"), bVar1)) {
    lower.field_2._M_local_buf[0xf] = '\x01';
    lower.field_2._M_local_buf[0xe] = '\x01';
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"false");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"f"), bVar1)) {
      lower.field_2._M_local_buf[0xf] = '\x01';
      lower.field_2._M_local_buf[0xe] = '\0';
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  if ((lower.field_2._M_local_buf[0xf] & 1U) == 0) {
    uVar2 = std::__cxx11::stoul(&this->m_str,(size_t *)0x0,10);
    lower.field_2._M_local_buf[0xe] = uVar2 != 0;
    lower.field_2._M_local_buf[0xf] = '\x01';
  }
  if (okptr != (bool *)0x0) {
    *okptr = (bool)(lower.field_2._M_local_buf[0xf] & 1);
  }
  return (bool)(lower.field_2._M_local_buf[0xe] & 1);
}

Assistant:

bool cali::StringConverter::to_bool(bool* okptr) const
{
    bool ok  = false;
    bool res = false;

    // try string

    {
        std::string lower;

        std::transform(m_str.begin(), m_str.end(), std::back_inserter(lower), ::tolower);

        if (lower == "true" || lower == "t") {
            ok  = true;
            res = true;
        } else if (lower == "false" || lower == "f") {
            ok  = true;
            res = false;
        }
    }

    // try numeral

    if (!ok) {
        try {
            unsigned long i = std::stoul(m_str);

            res = (i != 0);
            ok  = true;
        } catch (...) {
            ok = false;
        }
    }

    if (okptr)
        *okptr = ok;

    return res;
}